

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_usadd64_aarch64(void *d,void *a,void *b,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    lVar3 = *(ulong *)((long)a + uVar2) + *(ulong *)((long)b + uVar2);
    if (CARRY8(*(ulong *)((long)a + uVar2),*(ulong *)((long)b + uVar2))) {
      lVar3 = -1;
    }
    *(long *)((long)d + uVar2) = lVar3;
    uVar2 = uVar2 + 8;
  } while (uVar2 < uVar1 + 8);
  if ((desc >> 2 & 0xf8) <= uVar1) {
    return;
  }
  helper_gvec_usadd64_aarch64_cold_1();
  return;
}

Assistant:

void HELPER(gvec_usadd64)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint64_t)) {
        uint64_t ai = *(uint64_t *)((char *)a + i);
        uint64_t bi = *(uint64_t *)((char *)b + i);
        uint64_t di = ai + bi;
        if (di < ai) {
            di = UINT64_MAX;
        }
        *(uint64_t *)((char *)d + i) = di;
    }
    clear_high(d, oprsz, desc);
}